

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qlcdnumber.cpp
# Opt level: O0

void QLCDNumber::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  bool bVar1;
  SegmentStyle SVar2;
  QtMocHelpers *in_RCX;
  uint in_EDX;
  int in_ESI;
  double dVar3;
  void *_v_1;
  void *_v;
  QLCDNumber *_t;
  QLCDNumber *in_stack_ffffffffffffffa8;
  QLCDNumber *in_stack_ffffffffffffffb0;
  QLCDNumber *in_stack_ffffffffffffffb8;
  QLCDNumber *in_stack_ffffffffffffffc0;
  undefined8 in_stack_ffffffffffffffc8;
  double *pdVar4;
  code *in_stack_ffffffffffffffd0;
  
  SVar2 = (SegmentStyle)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
  if (in_ESI == 0) {
    in_stack_ffffffffffffffb8 = (QLCDNumber *)(ulong)in_EDX;
    switch(in_stack_ffffffffffffffb8) {
    case (QLCDNumber *)0x0:
      overflow((QLCDNumber *)0x5c0352);
      break;
    case (QLCDNumber *)0x1:
      display(in_stack_ffffffffffffffc0,(QString *)in_stack_ffffffffffffffb8);
      break;
    case (QLCDNumber *)0x2:
      display(in_stack_ffffffffffffffb8,(int)((ulong)in_stack_ffffffffffffffb0 >> 0x20));
      break;
    case (QLCDNumber *)0x3:
      display(in_stack_ffffffffffffffb8,(double)in_stack_ffffffffffffffb0);
      break;
    case (QLCDNumber *)0x4:
      setHexMode((QLCDNumber *)0x5c03a6);
      break;
    case (QLCDNumber *)0x5:
      setDecMode((QLCDNumber *)0x5c03b2);
      break;
    case (QLCDNumber *)0x6:
      setOctMode((QLCDNumber *)0x5c03be);
      break;
    case (QLCDNumber *)0x7:
      setBinMode((QLCDNumber *)0x5c03ca);
      break;
    case (QLCDNumber *)0x8:
      setSmallDecimalPoint(in_stack_ffffffffffffffc0,false);
    }
  }
  if (in_ESI == 5) {
    in_stack_ffffffffffffffd0 = overflow;
    bVar1 = QtMocHelpers::indexOfMethod<void(QLCDNumber::*)()>(in_RCX,(void **)overflow,0,0);
    if (bVar1) {
      return;
    }
  }
  if (in_ESI == 1) {
    pdVar4 = *(double **)in_RCX;
    in_stack_ffffffffffffffb0 = (QLCDNumber *)(ulong)in_EDX;
    switch(in_stack_ffffffffffffffb0) {
    case (QLCDNumber *)0x0:
      bVar1 = smallDecimalPoint(in_stack_ffffffffffffffb0);
      *(bool *)pdVar4 = bVar1;
      break;
    case (QLCDNumber *)0x1:
      SVar2 = digitCount(in_stack_ffffffffffffffb0);
      *(SegmentStyle *)pdVar4 = SVar2;
      break;
    case (QLCDNumber *)0x2:
      SVar2 = mode(in_stack_ffffffffffffffb0);
      *(SegmentStyle *)pdVar4 = SVar2;
      break;
    case (QLCDNumber *)0x3:
      SVar2 = segmentStyle(in_stack_ffffffffffffffa8);
      *(SegmentStyle *)pdVar4 = SVar2;
      break;
    case (QLCDNumber *)0x4:
      dVar3 = value(in_stack_ffffffffffffffb0);
      *pdVar4 = dVar3;
      break;
    case (QLCDNumber *)0x5:
      SVar2 = intValue(in_stack_ffffffffffffffb0);
      *(SegmentStyle *)pdVar4 = SVar2;
    }
    SVar2 = (SegmentStyle)((ulong)pdVar4 >> 0x20);
  }
  if (in_ESI == 2) {
    switch(in_EDX) {
    case 0:
      setSmallDecimalPoint(*(QLCDNumber **)in_RCX,SUB81((ulong)in_stack_ffffffffffffffb8 >> 0x38,0))
      ;
      break;
    case 1:
      setDigitCount((QLCDNumber *)CONCAT44(2,in_EDX),(int)((ulong)in_RCX >> 0x20));
      break;
    case 2:
      setMode(*(QLCDNumber **)in_RCX,(Mode)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
      break;
    case 3:
      setSegmentStyle((QLCDNumber *)in_stack_ffffffffffffffd0,SVar2);
      break;
    case 4:
      display(in_stack_ffffffffffffffb8,(double)in_stack_ffffffffffffffb0);
      break;
    case 5:
      display(in_stack_ffffffffffffffb8,(int)((ulong)in_stack_ffffffffffffffb0 >> 0x20));
    }
  }
  return;
}

Assistant:

void QLCDNumber::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QLCDNumber *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->overflow(); break;
        case 1: _t->display((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 2: _t->display((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 3: _t->display((*reinterpret_cast< std::add_pointer_t<double>>(_a[1]))); break;
        case 4: _t->setHexMode(); break;
        case 5: _t->setDecMode(); break;
        case 6: _t->setOctMode(); break;
        case 7: _t->setBinMode(); break;
        case 8: _t->setSmallDecimalPoint((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QLCDNumber::*)()>(_a, &QLCDNumber::overflow, 0))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<bool*>(_v) = _t->smallDecimalPoint(); break;
        case 1: *reinterpret_cast<int*>(_v) = _t->digitCount(); break;
        case 2: *reinterpret_cast<Mode*>(_v) = _t->mode(); break;
        case 3: *reinterpret_cast<SegmentStyle*>(_v) = _t->segmentStyle(); break;
        case 4: *reinterpret_cast<double*>(_v) = _t->value(); break;
        case 5: *reinterpret_cast<int*>(_v) = _t->intValue(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setSmallDecimalPoint(*reinterpret_cast<bool*>(_v)); break;
        case 1: _t->setDigitCount(*reinterpret_cast<int*>(_v)); break;
        case 2: _t->setMode(*reinterpret_cast<Mode*>(_v)); break;
        case 3: _t->setSegmentStyle(*reinterpret_cast<SegmentStyle*>(_v)); break;
        case 4: _t->display(*reinterpret_cast<double*>(_v)); break;
        case 5: _t->display(*reinterpret_cast<int*>(_v)); break;
        default: break;
        }
    }
}